

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int UTF8ToUTF16BE(uchar *outb,int *outlen,uchar *in,int *inlen)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  byte *pbVar4;
  int iVar5;
  uchar *processed;
  uint uVar6;
  int iVar7;
  long lVar8;
  unsigned_short *out;
  byte *pbVar9;
  byte *pbVar10;
  long lVar11;
  
  iVar5 = (int)in;
  iVar3 = -1;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && outb != (uchar *)0x0)) {
    if (in != (uchar *)0x0) {
      pbVar4 = outb;
      if (0 < (long)*inlen) {
        pbVar9 = in + *inlen;
        iVar3 = *outlen;
        do {
          bVar1 = *in;
          uVar6 = (uint)bVar1;
          lVar8 = 0;
          if ((char)bVar1 < '\0') {
            if (bVar1 < 0xc0) {
LAB_00144840:
              *outlen = (int)((ulong)((long)pbVar4 - (long)outb) >> 1);
              *inlen = (int)in - iVar5;
              return -2;
            }
            if (bVar1 < 0xe0) {
              uVar6 = bVar1 & 0x1f;
              lVar8 = 1;
            }
            else if (bVar1 < 0xf0) {
              uVar6 = bVar1 & 0xf;
              lVar8 = 2;
            }
            else {
              if (0xf7 < bVar1) goto LAB_00144840;
              uVar6 = bVar1 & 7;
              lVar8 = 3;
            }
          }
          pbVar10 = in + 1;
          iVar7 = (int)lVar8;
          if ((long)pbVar9 - (long)pbVar10 < lVar8) break;
          if (pbVar10 < pbVar9 && (char)bVar1 < '\0') {
            pbVar2 = in + 2;
            do {
              pbVar10 = pbVar2;
              iVar7 = iVar7 + -1;
              if (((pbVar10[-1] & 0xffffffc0) != 0x80) ||
                 (uVar6 = pbVar10[-1] & 0x3f | uVar6 << 6, iVar7 == 0)) break;
              pbVar2 = pbVar10 + 1;
            } while (pbVar10 < pbVar9);
            if (uVar6 < 0x10000) goto LAB_001447ab;
            if ((0x10ffff < uVar6) || (outb + (long)(iVar3 / 2) * 2 <= pbVar4 + 2)) break;
            *pbVar4 = (byte)(uVar6 - 0x10000 >> 0x12) | 0xd8;
            pbVar4[1] = (byte)(uVar6 - 0x10000 >> 10);
            pbVar4[2] = (byte)(uVar6 >> 8) & 3 | 0xdc;
            lVar8 = 4;
            lVar11 = 3;
            in = pbVar10;
          }
          else {
LAB_001447ab:
            if (outb + (long)(iVar3 / 2) * 2 <= pbVar4) break;
            *pbVar4 = (byte)(uVar6 >> 8);
            lVar8 = 2;
            lVar11 = 1;
            in = pbVar10;
          }
          pbVar4[lVar11] = (byte)uVar6;
          pbVar4 = pbVar4 + lVar8;
          if (pbVar9 <= in) break;
        } while( true );
      }
      *outlen = (int)pbVar4 - (int)outb;
      *inlen = (int)in - iVar5;
      return *outlen;
    }
    iVar3 = 0;
    *outlen = 0;
    *inlen = 0;
  }
  return iVar3;
}

Assistant:

static int
UTF8ToUTF16BE(unsigned char* outb, int *outlen,
            const unsigned char* in, int *inlen)
{
    unsigned short* out = (unsigned short*) outb;
    const unsigned char* processed = in;
    const unsigned char *const instart = in;
    unsigned short* outstart= out;
    unsigned short* outend;
    const unsigned char* inend;
    unsigned int c, d;
    int trailing;
    unsigned char *tmp;
    unsigned short tmp1, tmp2;

    /* UTF-16BE has no BOM */
    if ((outb == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend= in + *inlen;
    outend = out + (*outlen / 2);
    while (in < inend) {
      d= *in++;
      if      (d < 0x80)  { c= d; trailing= 0; }
      else if (d < 0xC0)  {
          /* trailing byte in leading position */
	  *outlen = out - outstart;
	  *inlen = processed - instart;
	  return(-2);
      } else if (d < 0xE0)  { c= d & 0x1F; trailing= 1; }
      else if (d < 0xF0)  { c= d & 0x0F; trailing= 2; }
      else if (d < 0xF8)  { c= d & 0x07; trailing= 3; }
      else {
          /* no chance for this in UTF-16 */
	  *outlen = out - outstart;
	  *inlen = processed - instart;
	  return(-2);
      }

      if (inend - in < trailing) {
          break;
      }

      for ( ; trailing; trailing--) {
          if ((in >= inend) || (((d= *in++) & 0xC0) != 0x80))  break;
          c <<= 6;
          c |= d & 0x3F;
      }

      /* assertion: c is a single UTF-4 value */
        if (c < 0x10000) {
            if (out >= outend)  break;
	    if (xmlLittleEndian) {
		tmp = (unsigned char *) out;
		*tmp = c >> 8;
		*(tmp + 1) = c;
		out++;
	    } else {
		*out++ = c;
	    }
        }
        else if (c < 0x110000) {
            if (out+1 >= outend)  break;
            c -= 0x10000;
	    if (xmlLittleEndian) {
		tmp1 = 0xD800 | (c >> 10);
		tmp = (unsigned char *) out;
		*tmp = tmp1 >> 8;
		*(tmp + 1) = (unsigned char) tmp1;
		out++;

		tmp2 = 0xDC00 | (c & 0x03FF);
		tmp = (unsigned char *) out;
		*tmp = tmp2 >> 8;
		*(tmp + 1) = (unsigned char) tmp2;
		out++;
	    } else {
		*out++ = 0xD800 | (c >> 10);
		*out++ = 0xDC00 | (c & 0x03FF);
	    }
        }
        else
	    break;
	processed = in;
    }
    *outlen = (out - outstart) * 2;
    *inlen = processed - instart;
    return(*outlen);
}